

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::divsMusashi<(moira::Core)0>(Moira *this,u32 op1,u32 op2)

{
  ulong uVar1;
  
  if (op2 == 0xffffffff && op1 == 0x80000000) {
    (this->reg).sr.n = false;
    (this->reg).sr.z = false;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    op1 = 0;
  }
  else {
    uVar1 = (long)(int)op1 / (long)(short)op2;
    if ((long)(short)uVar1 == uVar1) {
      op1 = (int)op1 % (int)(short)op2 << 0x10 | (uint)uVar1 & 0xffff;
      (this->reg).sr.z = uVar1 != 0;
      (this->reg).sr.n = (bool)((byte)(uVar1 >> 0xf) & 1);
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
    }
    else {
      (this->reg).sr.v = true;
    }
  }
  return op1;
}

Assistant:

u32
Moira::divsMusashi(u32 op1, u32 op2)
{
    u32 result;

    if (op1 == 0x80000000 && (i32)op2 == -1) {

        reg.sr.z = 0;
        reg.sr.n = 0;
        reg.sr.v = 0;
        reg.sr.c = 0;
        result = 0;

    } else {

        i64 quotient  = (i64)(i32)op1 / (i16)op2;
        i16 remainder = (i64)(i32)op1 % (i16)op2;

        if (quotient == (i16)quotient) {

            result = (quotient & 0xffff) | (u16)remainder << 16;

            reg.sr.z = quotient;
            reg.sr.n = NBIT<Word>(quotient);
            reg.sr.v = 0;
            reg.sr.c = 0;

        } else {

            result = op1;
            reg.sr.v = 1;
        }
    }

    return result;
}